

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  undefined8 *puVar2;
  ostringstream *this_00;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int extraout_EAX;
  GLenum GVar8;
  int extraout_EAX_00;
  RenderTarget *pRVar9;
  undefined8 uVar10;
  QuadRenderer *this_01;
  ReferenceQuadRenderer *this_02;
  TextureLevel *this_03;
  long lVar11;
  int iVar12;
  ChannelOrder CVar13;
  BlendCase *this_04;
  undefined1 local_198 [384];
  
  CVar13 = RGBA;
  this_04 = this;
  if (this->m_useSrgbFbo == false) {
    this_04 = (BlendCase *)(this->super_TestCase).m_context;
    pRVar9 = Context::getRenderTarget((Context *)this_04);
    CVar13 = RGBA - ((pRVar9->m_pixelFormat).alphaBits == 0);
  }
  if (init()::baseGradientColors == '\0') {
    init((EVP_PKEY_CTX *)this_04);
  }
  lVar11 = 0;
  do {
    fVar4 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 4);
    fVar5 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 8);
    fVar6 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 0xc);
    pfVar1 = (float *)((long)(this->m_firstQuad).color[0].m_data + lVar11);
    *pfVar1 = (*(float *)((long)init::baseGradientColors[0].m_data + lVar11) + -0.5) * 0.2 + 0.5;
    pfVar1[1] = (fVar4 + -0.5) * 0.2 + 0.5;
    pfVar1[2] = (fVar5 + -0.5) * 0.2 + 0.5;
    pfVar1[3] = (fVar6 + -0.5) * 0.2 + 0.5;
    puVar2 = (undefined8 *)((long)(this->m_firstQuad).color[0].m_data + lVar11);
    uVar10 = puVar2[1];
    puVar3 = (undefined8 *)((long)(this->m_firstQuadInt).color[0].m_data + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar10;
    fVar4 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 4);
    fVar5 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 8);
    fVar6 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 0xc);
    pfVar1 = (float *)((long)(this->m_secondQuad).color[0].m_data + lVar11);
    *pfVar1 = (1.0 - *(float *)((long)init::baseGradientColors[0].m_data + lVar11)) + -0.5 + 0.5;
    pfVar1[1] = (1.0 - fVar4) + -0.5 + 0.5;
    pfVar1[2] = (1.0 - fVar5) + -0.5 + 0.5;
    pfVar1[3] = (1.0 - fVar6) + -0.5 + 0.5;
    puVar2 = (undefined8 *)((long)(this->m_secondQuad).color[0].m_data + lVar11);
    uVar10 = puVar2[1];
    puVar3 = (undefined8 *)((long)(this->m_secondQuadInt).color[0].m_data + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar10;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  iVar7 = this->m_renderWidth;
  if (0x3f < iVar7) {
    iVar7 = 0x40;
  }
  this->m_viewportWidth = iVar7;
  iVar12 = 0x40;
  if (this->m_renderHeight < 0x40) {
    iVar12 = this->m_renderHeight;
  }
  this->m_viewportHeight = iVar12;
  *(undefined8 *)(this->m_firstQuadInt).posA.m_data = 0;
  *(undefined8 *)(this->m_secondQuadInt).posA.m_data = 0;
  uVar10 = CONCAT44(iVar12 + -1,iVar7 + -1);
  *(undefined8 *)(this->m_firstQuadInt).posB.m_data = uVar10;
  *(undefined8 *)(this->m_secondQuadInt).posB.m_data = uVar10;
  this_01 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_300_ES);
  this->m_renderer = this_01;
  this_02 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_02);
  this->m_referenceRenderer = this_02;
  this_03 = (TextureLevel *)operator_new(0x28);
  if (this->m_useSrgbFbo != false) {
    CVar13 = sRGBA;
  }
  local_198._4_4_ = UNORM_INT8;
  local_198._0_4_ = CVar13;
  tcu::TextureLevel::TextureLevel
            (this_03,(TextureFormat *)local_198,this->m_viewportWidth,this->m_viewportHeight,1);
  this->m_refColorBuffer = this_03;
  this->m_curParamSetNdx = 0;
  iVar7 = extraout_EAX;
  if (this->m_useSrgbFbo == true) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Using FBO of size (",0x13);
    std::ostream::operator<<(this_00,this->m_renderWidth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,this->m_renderHeight);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,") with format GL_SRGB8_ALPHA8",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    glwGenRenderbuffers(1,&this->m_colorRbo);
    GVar8 = glwGetError();
    glu::checkError(GVar8,"glGenRenderbuffers(1, &m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xd8);
    glwBindRenderbuffer(0x8d41,this->m_colorRbo);
    GVar8 = glwGetError();
    glu::checkError(GVar8,"glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xd9);
    glwRenderbufferStorage(0x8d41,0x8c43,this->m_renderWidth,this->m_renderHeight);
    GVar8 = glwGetError();
    glu::checkError(GVar8,
                    "glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xda);
    glwGenFramebuffers(1,&this->m_fbo);
    GVar8 = glwGetError();
    glu::checkError(GVar8,"glGenFramebuffers(1, &m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xdc);
    glwBindFramebuffer(0x8d40,this->m_fbo);
    GVar8 = glwGetError();
    glu::checkError(GVar8,"glBindFramebuffer(GL_FRAMEBUFFER, m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xdd);
    glwFramebufferRenderbuffer(0x8d40,0x8ce0,0x8d41,this->m_colorRbo);
    GVar8 = glwGetError();
    glu::checkError(GVar8,
                    "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xde);
    iVar7 = extraout_EAX_00;
  }
  return iVar7;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = !m_useSrgbFbo && m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportWidth		= de::min<int>(m_renderWidth,	MAX_VIEWPORT_WIDTH);
	m_viewportHeight	= de::min<int>(m_renderHeight,	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,						0);
	m_secondQuadInt.posA	= tcu::IVec2(0,						0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_300_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportWidth, m_viewportHeight);

	m_curParamSetNdx = 0;

	if (m_useSrgbFbo)
	{
		m_testCtx.getLog() << TestLog::Message << "Using FBO of size (" << m_renderWidth << ", " << m_renderHeight << ") with format GL_SRGB8_ALPHA8" << TestLog::EndMessage;

		GLU_CHECK_CALL(glGenRenderbuffers(1, &m_colorRbo));
		GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo));
		GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight));

		GLU_CHECK_CALL(glGenFramebuffers(1, &m_fbo));
		GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, m_fbo));
		GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo));
	}
}